

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2edge_crossings.cc
# Opt level: O2

longdouble *
S2::GetProjection<long_double>
          (longdouble *__return_storage_ptr__,Vector3<long_double> *x,Vector3<long_double> *a_norm,
          longdouble a_norm_len,Vector3<long_double> *a0,Vector3<long_double> *a1,longdouble *error)

{
  BasicVector<Vector3,_long_double,_3UL> *pBVar1;
  bool bVar2;
  longdouble *plVar3;
  D *b;
  BasicVector<Vector3,_long_double,_3UL> *this;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  Vector3<long_double> x1;
  Vector3<long_double> x0;
  D local_98;
  BasicVector<Vector3,_long_double,_3UL> local_68 [56];
  
  util::math::internal_vector::BasicVector<Vector3,_long_double,_3UL>::operator-
            ((BasicVector<Vector3,_long_double,_3UL> *)__return_storage_ptr__,a_norm);
  util::math::internal_vector::BasicVector<Vector3,_long_double,_3UL>::operator-
            ((BasicVector<Vector3,_long_double,_3UL> *)__return_storage_ptr__,a0);
  util::math::internal_vector::BasicVector<Vector3,_long_double,_3UL>::Norm2(local_68);
  util::math::internal_vector::BasicVector<Vector3,_long_double,_3UL>::Norm2
            ((BasicVector<Vector3,_long_double,_3UL> *)&local_98);
  pBVar1 = local_68;
  if (in_ST1 <= in_ST0) {
    pBVar1 = (BasicVector<Vector3,_long_double,_3UL> *)&local_98;
    if ((in_ST0 == in_ST1) && (!NAN(in_ST0) && !NAN(in_ST1))) {
      this = local_68;
      bVar2 = util::math::internal_vector::BasicVector<Vector3,_long_double,_3UL>::operator<
                        (this,&local_98);
      if (bVar2) goto LAB_0022d4bd;
    }
  }
  this = pBVar1;
LAB_0022d4bd:
  sqrtl();
  plVar3 = util::math::internal_vector::BasicVector<Vector3,_long_double,_3UL>::DotProd
                     ((longdouble *)this,(BasicVector<Vector3,_long_double,_3UL> *)x,b);
  *(longdouble *)a1->c_ =
       (ABS(in_ST3) * (longdouble)1.5 +
       in_ST2 * (a_norm_len * (longdouble)6.964101615137754 + (longdouble)6.153480596427404e-15)) *
       (longdouble)5.421011e-20;
  return plVar3;
}

Assistant:

static T GetProjection(const Vector3<T>& x,
                       const Vector3<T>& a_norm, T a_norm_len,
                       const Vector3<T>& a0, const Vector3<T>& a1,
                       T* error) {
  // The error in the dot product is proportional to the lengths of the input
  // vectors, so rather than using "x" itself (a unit-length vector) we use
  // the vectors from "x" to the closer of the two edge endpoints.  This
  // typically reduces the error by a huge factor.
  Vector3<T> x0 = x - a0;
  Vector3<T> x1 = x - a1;
  T x0_dist2 = x0.Norm2();
  T x1_dist2 = x1.Norm2();

  // If both distances are the same, we need to be careful to choose one
  // endpoint deterministically so that the result does not change if the
  // order of the endpoints is reversed.
  T dist, result;
  if (x0_dist2 < x1_dist2 || (x0_dist2 == x1_dist2 && x0 < x1)) {
    dist = sqrt(x0_dist2);
    result = x0.DotProd(a_norm);
  } else {
    dist = sqrt(x1_dist2);
    result = x1.DotProd(a_norm);
  }
  // This calculation bounds the error from all sources: the computation of
  // the normal, the subtraction of one endpoint, and the dot product itself.
  // (DBL_ERR appears because the input points are assumed to be normalized in
  // double precision rather than in the given type T.)
  //
  // For reference, the bounds that went into this calculation are:
  // ||N'-N|| <= ((1 + 2 * sqrt(3))||N|| + 32 * sqrt(3) * DBL_ERR) * T_ERR
  // |(A.B)'-(A.B)| <= (1.5 * (A.B) + 1.5 * ||A|| * ||B||) * T_ERR
  // ||(X-Y)'-(X-Y)|| <= ||X-Y|| * T_ERR
  constexpr T T_ERR = s2pred::rounding_epsilon<T>();
  *error = (((3.5 + 2 * sqrt(3)) * a_norm_len + 32 * sqrt(3) * DBL_ERR)
            * dist + 1.5 * fabs(result)) * T_ERR;
  return result;
}